

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O1

void __thiscall MyServerConnection::OnTick(MyServerConnection *this,uint64_t nowUsec)

{
  undefined1 auVar1 [64];
  int iVar2;
  undefined1 auVar3 [16];
  uint16_t uVar4;
  uint32_t uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  TonkStatus status;
  uint8_t data [2];
  TonkStatus local_5c0;
  char local_5a8;
  uint16_t local_5a7;
  undefined2 local_5a5;
  undefined1 local_5a3;
  undefined2 local_5a2;
  undefined1 local_5a0;
  uint32_t local_59f;
  
  iVar2 = this->StatusLogCounter;
  this->StatusLogCounter = iVar2 + 1;
  if (0x62 < iVar2) {
    this->StatusLogCounter = 0;
    test::LogTonkStatus(&this->super_SDKConnection);
  }
  tonk::SDKConnection::GetStatus(&local_5c0,&this->super_SDKConnection);
  local_5a8 = -0x38;
  OnTick::counter = OnTick::counter + '\x01';
  local_5a7 = CONCAT11(local_5a7._1_1_,OnTick::counter);
  tonk::SDKConnection::Send(&this->super_SDKConnection,&local_5a8,2,200);
  if (((ulong)local_5c0.LowPriQueueMsec < 0x32) &&
     (uVar8 = (ulong)local_5c0.AppBPS * (0x32 - (ulong)local_5c0.LowPriQueueMsec), 999 < uVar8)) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar8;
    uVar9 = (uint)((ulong)(SUB164(auVar3 * ZEXT816(0x4189374bc6a7f0),8) + 0x577) * 0x2ecfb9c9 >>
                  0x28);
    uVar7 = 1;
    if (1 < uVar9) {
      uVar7 = uVar9;
    }
    uVar9 = 0;
    do {
      memset(&local_5a8,0,0x578);
      lVar6 = 0;
      auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar11 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar12 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar15 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar18 = vmovdqa64_avx512f(_DAT_0010b4c0);
      auVar19 = vpbroadcastq_avx512f(ZEXT816(0x578));
      auVar20 = vpbroadcastq_avx512f(ZEXT816(0x40));
      auVar21 = vpbroadcastb_avx512bw(ZEXT116(0x40));
      do {
        vpcmpuq_avx512f(auVar10,auVar19,1);
        vpcmpuq_avx512f(auVar11,auVar19,1);
        vpcmpuq_avx512f(auVar12,auVar19,1);
        vpcmpuq_avx512f(auVar13,auVar19,1);
        vpcmpuq_avx512f(auVar14,auVar19,1);
        vpcmpuq_avx512f(auVar15,auVar19,1);
        vpcmpuq_avx512f(auVar16,auVar19,1);
        vpcmpuq_avx512f(auVar17,auVar19,1);
        auVar1 = vmovdqu8_avx512bw(auVar18);
        *(undefined1 (*) [64])(&local_5a8 + lVar6) = auVar1;
        lVar6 = lVar6 + 0x40;
        auVar10 = vpaddq_avx512f(auVar10,auVar20);
        auVar11 = vpaddq_avx512f(auVar11,auVar20);
        auVar12 = vpaddq_avx512f(auVar12,auVar20);
        auVar13 = vpaddq_avx512f(auVar13,auVar20);
        auVar14 = vpaddq_avx512f(auVar14,auVar20);
        auVar15 = vpaddq_avx512f(auVar15,auVar20);
        auVar16 = vpaddq_avx512f(auVar16,auVar20);
        auVar17 = vpaddq_avx512f(auVar17,auVar20);
        auVar18 = vpaddb_avx512bw(auVar18,auVar21);
      } while (lVar6 != 0x580);
      uVar4 = tonk::SDKConnection::ToRemoteTime16(&this->super_SDKConnection,nowUsec);
      uVar5 = tonk::SDKConnection::ToRemoteTime23(&this->super_SDKConnection,nowUsec);
      local_5a8 = ((byte)local_5c0.Flags & 1) + 7;
      local_5a3 = (undefined1)(uVar5 >> 0x10);
      local_5a5 = (undefined2)uVar5;
      local_5a0 = 0xad;
      local_5a2 = 0xd12d;
      local_59f = this->NextOutgoingWord;
      this->NextOutgoingWord = local_59f + 1;
      local_5a7 = uVar4;
      test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_send);
      tonk::SDKConnection::Send(&this->super_SDKConnection,&local_5a8,0x578,0x98);
      test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_send);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void MyServerConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);
    }

    TonkStatus status = GetStatus();

    {
        static uint8_t counter = 0;
        uint8_t data[2] = { 200, ++counter };
        Send(data, sizeof(data), TonkChannel_Unordered);
    }

#ifdef TONK_ENABLE_1MBPS_DATA_SERVER
    if (status.LowPriQueueMsec < kLowPriQueueDepthMsec)
    {
        unsigned fillMsec = kLowPriQueueDepthMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}